

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  ushort uVar2;
  bool bVar3;
  Vdbe *pVVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  Mem *pMVar8;
  char **ppcVar9;
  char *pcVar10;
  char *pcVar11;
  char **ppcVar12;
  ulong uVar13;
  ulong uVar14;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  Vdbe *local_80;
  char **local_78;
  uint local_6c;
  sqlite3 *local_68;
  char *local_60;
  ulong local_58;
  sqlite3_callback local_50;
  char **local_48;
  char **local_40;
  void *local_38;
  
  local_80 = (Vdbe *)0x0;
  local_50 = xCallback;
  local_38 = pArg;
  iVar5 = sqlite3SafetyCheckOk(db);
  if (iVar5 == 0) {
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1cb04,
                "fb90e7189ae6d62e77ba3a308ca5d683f90bbe633cf681865365b8e92792d1c7");
    uVar6 = 0x15;
  }
  else {
    pcVar11 = "";
    if (zSql != (char *)0x0) {
      pcVar11 = zSql;
    }
    local_48 = pzErrMsg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    db->errCode = 0;
    if (db->pErr != (sqlite3_value *)0x0) {
      sqlite3ErrorFinish(db,0);
    }
    local_78 = (char **)0x0;
    local_68 = db;
    do {
      if (*pcVar11 == '\0') {
        uVar6 = 0;
        break;
      }
      local_80 = (Vdbe *)0x0;
      uVar6 = sqlite3LockAndPrepare
                        (db,pcVar11,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_80,&local_60);
      iVar5 = 2;
      if (uVar6 == 0) {
        if (local_80 == (Vdbe *)0x0) {
          uVar6 = 0;
          pcVar11 = local_60;
        }
        else {
          uVar2 = local_80->nResColumn;
          uVar14 = (ulong)uVar2;
          local_58 = (ulong)uVar2 << 4 | 8;
          bVar3 = false;
          ppcVar12 = (char **)0x0;
          do {
            pVVar4 = local_80;
            uVar6 = sqlite3_step((sqlite3_stmt *)local_80);
            if (local_50 == (sqlite3_callback)0x0) {
LAB_0013689c:
              if (uVar6 == 100) {
                iVar5 = 0;
                uVar6 = 100;
              }
              else {
                uVar6 = sqlite3VdbeFinalize(local_80);
                local_80 = (Vdbe *)0x0;
                pcVar11 = local_60 + -1;
                do {
                  pbVar1 = (byte *)(pcVar11 + 1);
                  pcVar11 = pcVar11 + 1;
                } while ((""[*pbVar1] & 1) != 0);
                iVar5 = 5;
              }
            }
            else {
              if (uVar6 != 100) {
                if (uVar6 == 0x65 && !bVar3) {
                  if ((local_68->flags & 0x100) != 0) goto LAB_0013678a;
                  bVar3 = false;
                }
                goto LAB_0013689c;
              }
LAB_0013678a:
              local_6c = uVar6;
              if (bVar3) {
LAB_00136797:
                if (local_6c == 100) {
                  ppcVar12 = local_78 + uVar14;
                  uVar13 = 0;
                  if (uVar14 != 0) {
                    do {
                      puVar7 = sqlite3_column_text((sqlite3_stmt *)local_80,(int)uVar13);
                      pVVar4 = local_80;
                      ppcVar12[uVar13] = (char *)puVar7;
                      if (puVar7 == (uchar *)0x0) {
                        pMVar8 = columnMem((sqlite3_stmt *)local_80,(int)uVar13);
                        uVar6._0_2_ = pMVar8->flags;
                        uVar6._2_1_ = pMVar8->enc;
                        uVar6._3_1_ = pMVar8->eSubtype;
                        columnMallocFailure((sqlite3_stmt *)pVVar4);
                        if ((0xaaaaaaaaU >> (uVar6 & 0x1f) & 1) == 0) {
                          iVar5 = 6;
                          bVar3 = true;
                          uVar6 = 100;
                          if ((local_68->mallocFailed == '\0') && (local_68->bBenignMalloc == '\0'))
                          {
                            local_68->mallocFailed = '\x01';
                            if (0 < local_68->nVdbeExec) {
                              (local_68->u1).isInterrupted = 1;
                            }
                            (local_68->lookaside).bDisable = (local_68->lookaside).bDisable + 1;
                          }
                          goto LAB_001368da;
                        }
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar14 != uVar13);
                  }
                  ppcVar12[uVar13] = (char *)0x0;
                }
                iVar5 = (*local_50)(local_38,(uint)uVar2,ppcVar12,local_78);
                if (iVar5 == 0) {
                  bVar3 = true;
                  uVar6 = local_6c;
                  goto LAB_0013689c;
                }
                sqlite3VdbeFinalize(local_80);
                local_80 = (Vdbe *)0x0;
                local_68->errCode = 4;
                sqlite3ErrorFinish(local_68,4);
                iVar5 = 6;
                bVar3 = true;
                uVar6 = 4;
              }
              else {
                if (local_68 == (sqlite3 *)0x0) {
                  ppcVar9 = (char **)sqlite3Malloc(local_58);
                }
                else {
                  ppcVar9 = (char **)sqlite3DbMallocRawNN(local_68,local_58);
                }
                if (ppcVar9 != (char **)0x0) {
                  local_78 = ppcVar9;
                  if (uVar14 != 0) {
                    uVar13 = 0;
                    local_40 = ppcVar12;
                    do {
                      pcVar10 = sqlite3_column_name((sqlite3_stmt *)pVVar4,(int)uVar13);
                      ppcVar9[uVar13] = pcVar10;
                      uVar13 = uVar13 + 1;
                      ppcVar12 = local_40;
                    } while (uVar14 != uVar13);
                  }
                  goto LAB_00136797;
                }
                iVar5 = 6;
                local_78 = (char **)0x0;
                bVar3 = false;
                uVar6 = local_6c;
              }
            }
LAB_001368da:
            db = local_68;
          } while (iVar5 == 0);
          if (iVar5 == 5) {
            if (local_78 != (char **)0x0) {
              sqlite3DbFreeNN(local_68,local_78);
            }
            local_78 = (char **)0x0;
            iVar5 = 0;
          }
        }
      }
      if ((iVar5 != 0) && (iVar5 != 2)) {
        if (iVar5 != 6) {
          return iVar5;
        }
        break;
      }
    } while (uVar6 == 0);
    if (local_80 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_80);
    }
    ppcVar12 = local_48;
    if (local_78 != (char **)0x0) {
      sqlite3DbFreeNN(db,local_78);
    }
    if ((uVar6 == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      uVar6 = 7;
    }
    else {
      uVar6 = uVar6 & db->errMask;
    }
    if ((ppcVar12 == (char **)0x0) || (uVar6 == 0)) {
      if (ppcVar12 != (char **)0x0) {
        *ppcVar12 = (char *)0x0;
      }
    }
    else {
      pcVar11 = sqlite3_errmsg(db);
      pcVar11 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar11);
      *ppcVar12 = pcVar11;
      if (pcVar11 == (char *)0x0) {
        db->errCode = 7;
        uVar6 = 7;
        sqlite3ErrorFinish(db,7);
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar6;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }

    callbackIsInit = 0;
    nCol = sqlite3_column_count(pStmt);

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}